

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int readsettings(char *name)

{
  bool bVar1;
  size_t sVar2;
  ssize_t sVar3;
  ulong uVar4;
  char *in_RDI;
  unsigned_long id;
  _Bool done;
  int j;
  int entrylen;
  char buf [142];
  char fname [41];
  int fd;
  int local_e0;
  int local_dc;
  char local_d8 [10];
  byte local_ce;
  char local_48 [52];
  int local_14;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  memset(local_d8,0,0x8e);
  bVar1 = false;
  if (canfd_mode == 0) {
    local_dc = 0x1d;
    strcpy(local_48,"sniffset.");
  }
  else {
    if (canfd_mode != 1) {
      printf("readsettings failed due to unspecified CAN FD mode\n");
      return -1;
    }
    local_dc = 0x8d;
    strcpy(local_48,"sniffset_fd.");
  }
  sVar2 = strlen(local_48);
  strncat(local_48,local_10,0x28 - sVar2);
  local_14 = open(local_48,0);
  if (local_14 < 1) {
    local_4 = -1;
  }
  else {
    idx = 0;
    do {
      while( true ) {
        if (bVar1) goto LAB_00102fe0;
        sVar3 = read(local_14,local_d8,(long)local_dc);
        if (sVar3 == local_dc) break;
        bVar1 = true;
      }
      uVar4 = strtoul(local_d8 + 1,(char **)0x0,0x10);
      sniftab[idx].current.can_id = (canid_t)uVar4;
      if ((local_ce & 1) == 0) {
        sniftab[idx].flags = sniftab[idx].flags & 0xfffffffe;
        local_e0 = max_dlen;
      }
      else {
        sniftab[idx].flags = sniftab[idx].flags | 1;
        local_e0 = max_dlen;
      }
      while (local_e0 = local_e0 + -1, -1 < local_e0) {
        uVar4 = strtoul(local_d8 + (local_e0 * 2 + 0xc),(char **)0x0,0x10);
        *(char *)((long)idx * 0x158 + 0x108298 + (long)local_e0) = (char)uVar4;
        local_d8[local_e0 * 2 + 0xc] = '\0';
      }
      idx = idx + 1;
    } while (idx < 0x800);
LAB_00102fe0:
    close(local_14);
    local_4 = idx;
  }
  return local_4;
}

Assistant:

int readsettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	char buf[142] = {0};
	int entrylen;
	int j;
	bool done = false;

	if (canfd_mode == CANFD_OFF) {
		entrylen = 29;
		strcpy(fname, SETFNAME);
	} else if (canfd_mode == CANFD_ON) {
		entrylen = 141;
		strcpy(fname, SETFDFNAME);
	} else {
		printf("readsettings failed due to unspecified CAN FD mode\n");
		return -1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_RDONLY);

	if (fd <= 0) {
		return -1;
	}
	idx = 0;
	while (!done) {
		if (read(fd, &buf, entrylen) != entrylen) {
			done = true;
			continue;
		}
		unsigned long id = strtoul(&buf[1], NULL, 16);

		sniftab[idx].current.can_id = id;

		if (buf[10] & 1)
			do_set(idx, ENABLE);
		else
			do_clr(idx, ENABLE);

		for (j = max_dlen - 1; j >= 0 ; j--) {
			sniftab[idx].notch.data[j] =
				(__u8) strtoul(&buf[2*j+12], NULL, 16) & 0xFF;
			buf[2*j+12] = 0; /* cut off each time */
		}

		if (++idx >= MAX_SLOTS)
			break;

	}
	close(fd);
	return idx;
}